

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandBmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  undefined8 local_58;
  char *local_50;
  int iFrames;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_58 = 0;
  Extra_UtilGetoptReset();
  local_5c = 1;
  local_60 = 1000;
  local_70 = 100000;
  local_74 = 0x14;
  local_64 = 0;
  local_6c = 0;
  local_68 = 0;
  local_50 = (char *)0x0;
LAB_0020c34f:
  iVar1 = Extra_UtilGetopt(argc,argv,"FNCGDLrvh");
  iVar3 = globalUtilOptind;
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
      break;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_58 = CONCAT44(extraout_var,uVar2);
joined_r0x0020c46e:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
switchD_0020c36b_caseD_45:
      iVar3 = -2;
      Abc_Print(-2,"usage: bmc [-FNC num] [-L file] [-rcvh]\n");
      Abc_Print(-2,"\t         performs bounded model checking with static unrolling\n");
      Abc_Print(-2,"\t-F num : the number of time frames [default = %d]\n",(ulong)local_74);
      Abc_Print(-2,"\t-N num : the max number of nodes in the frames [default = %d]\n",
                (ulong)local_70);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",local_58);
      pcVar4 = "no logging";
      if (local_50 != (char *)0x0) {
        pcVar4 = local_50;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",pcVar4);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_6c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar4);
      if (local_68 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0020c685:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
    goto LAB_0020c34f;
  case 0x44:
    if (globalUtilOptind < argc) {
      local_60 = atoi(argv[globalUtilOptind]);
      uVar2 = local_60;
      goto joined_r0x0020c46e;
    }
    pcVar4 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
    goto switchD_0020c36b_caseD_45;
  case 0x46:
    if (globalUtilOptind < argc) {
      local_74 = atoi(argv[globalUtilOptind]);
      uVar2 = local_74;
      goto joined_r0x0020c46e;
    }
    pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      local_64 = atoi(argv[globalUtilOptind]);
      uVar2 = local_64;
      goto joined_r0x0020c46e;
    }
    pcVar4 = "Command line switch \"-G\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_50 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0020c34f;
    }
    pcVar4 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      local_70 = atoi(argv[globalUtilOptind]);
      uVar2 = local_70;
      goto joined_r0x0020c46e;
    }
    pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  default:
    if (iVar1 == 0x61) {
      local_5c = local_5c ^ 1;
    }
    else if (iVar1 == 0x72) {
      local_6c = local_6c ^ 1;
    }
    else {
      if (iVar1 != 0x76) {
        if (iVar1 == -1) {
          if (pNtk != (Abc_Ntk_t *)0x0) {
            if (pNtk->ntkType == ABC_NTK_STRASH) {
              if (pNtk->nObjCounts[8] != 0) {
                iVar3 = Abc_NtkDarBmc(pNtk,0,local_74,local_70,local_60,0,(int)local_58,local_64,
                                      local_6c,local_5c,0,0,local_68,&iFrames);
                pAbc->Status = iVar3;
                pAbc->nFrames = iFrames;
                Abc_FrameReplaceCex(pAbc,&pNtk->pSeqModel);
                if (local_50 == (char *)0x0) {
                  return 0;
                }
                Abc_NtkWriteLogFile(local_50,pAbc->pCex,pAbc->Status,pAbc->nFrames,"bmc");
                return 0;
              }
              pcVar4 = "Does not work for combinational networks.\n";
            }
            else {
              pcVar4 = "Currently only works for structurally hashed circuits.\n";
            }
            Abc_Print(-1,pcVar4);
            return 0;
          }
          pcVar4 = "Empty network.\n";
          iVar3 = -1;
          goto LAB_0020c685;
        }
        goto switchD_0020c36b_caseD_45;
      }
      local_68 = local_68 ^ 1;
    }
    goto LAB_0020c34f;
  }
  Abc_Print(-1,pcVar4);
  goto switchD_0020c36b_caseD_45;
}

Assistant:

int Abc_CommandBmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nFrames;
    int nSizeMax;
    int nBTLimit;
    int nBTLimitAll;
    int nNodeDelta;
    int fRewrite;
    int fNewAlgo;
    int nCofFanLit;
    int fVerbose;
    int iFrames;
    char * pLogFileName = NULL;

    extern int Abc_NtkDarBmc( Abc_Ntk_t * pNtk, int nStart, int nFrames, int nSizeMax, int nNodeDelta, int nTimeOut, int nBTLimit, int nBTLimitAll, int fRewrite, int fNewAlgo, int fOrDecomp, int nCofFanLit, int fVerbose, int * piFrames );
    // set defaults
    nFrames     =       20;
    nSizeMax    =   100000;
    nBTLimit    =        0;
    nBTLimitAll =        0;
    nNodeDelta  =     1000;
    fRewrite    =        0;
    fNewAlgo    =        1;
    nCofFanLit  =        0;
    fVerbose    =        0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FNCGDLrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSizeMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimitAll = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimitAll < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodeDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodeDelta < 0 )
                goto usage;
            break;
/*
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofFanLit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofFanLit < 0 )
                goto usage;
            break;
*/
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            fRewrite ^= 1;
            break;
        case 'a':
            fNewAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "Does not work for combinational networks.\n" );
        return 0;
    }
    pAbc->Status = Abc_NtkDarBmc( pNtk, 0, nFrames, nSizeMax, nNodeDelta, 0, nBTLimit, nBTLimitAll, fRewrite, fNewAlgo, 0, nCofFanLit, fVerbose, &iFrames );
    pAbc->nFrames = iFrames;
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "bmc" );
    return 0;

usage:
    Abc_Print( -2, "usage: bmc [-FNC num] [-L file] [-rcvh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking with static unrolling\n" );
    Abc_Print( -2, "\t-F num : the number of time frames [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-N num : the max number of nodes in the frames [default = %d]\n", nSizeMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nBTLimit );
//    Abc_Print( -2, "\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n", nCofFanLit );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", fRewrite? "yes": "no" );
//    Abc_Print( -2, "\t-a     : toggle SAT sweeping and SAT solving [default = %s]\n", fNewAlgo? "SAT solving": "SAT sweeping" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}